

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444_writer.c
# Opt level: O0

void rfc5444_writer_register_target(rfc5444_writer *writer,rfc5444_writer_target *interf)

{
  list_entity *plVar1;
  list_entity *plVar2;
  rfc5444_writer_target *interf_local;
  rfc5444_writer *writer_local;
  
  if (writer->_state != RFC5444_WRITER_NONE) {
    __assert_fail("writer->_state == RFC5444_WRITER_NONE",
                  "/workspace/llm4binary/github/license_c_cmakelists/OLSR[P]OONF/src/librfc5444/rfc5444_writer.c"
                  ,0x21a,
                  "void rfc5444_writer_register_target(struct rfc5444_writer *, struct rfc5444_writer_target *)"
                 );
  }
  if ((interf->packet_buffer != (uint8_t *)0x0) && (interf->packet_size != 0)) {
    (interf->_pkt).buffer = interf->packet_buffer;
    _rfc5444_tlv_writer_init(&interf->_pkt,interf->packet_size,interf->packet_size);
    interf->_is_flushed = true;
    plVar2 = &interf->_target_node;
    plVar1 = (writer->_targets).prev;
    plVar2->next = &writer->_targets;
    (interf->_target_node).prev = plVar1;
    (writer->_targets).prev = plVar2;
    plVar1->next = plVar2;
    return;
  }
  __assert_fail("interf->packet_buffer != NULL && interf->packet_size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/OLSR[P]OONF/src/librfc5444/rfc5444_writer.c"
                ,0x21d,
                "void rfc5444_writer_register_target(struct rfc5444_writer *, struct rfc5444_writer_target *)"
               );
}

Assistant:

void
rfc5444_writer_register_target(struct rfc5444_writer *writer, struct rfc5444_writer_target *interf) {
#if WRITER_STATE_MACHINE == true
  assert(writer->_state == RFC5444_WRITER_NONE);
#endif

  assert(interf->packet_buffer != NULL && interf->packet_size > 0);

  interf->_pkt.buffer = interf->packet_buffer;
  _rfc5444_tlv_writer_init(&interf->_pkt, interf->packet_size, interf->packet_size);

  interf->_is_flushed = true;

  list_add_tail(&writer->_targets, &interf->_target_node);
}